

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.h
# Opt level: O2

void __thiscall
spvtools::opt::AggressiveDCEPass::AggressiveDCEPass
          (AggressiveDCEPass *this,bool preserve_interface,bool remove_outputs)

{
  MemPass::MemPass(&this->super_MemPass);
  (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)&PTR__AggressiveDCEPass_008ad848;
  this->preserve_interface_ = preserve_interface;
  this->remove_outputs_ = remove_outputs;
  (this->entry_point_with_no_calls_cache_)._M_h._M_buckets =
       &(this->entry_point_with_no_calls_cache_)._M_h._M_single_bucket;
  (this->entry_point_with_no_calls_cache_)._M_h._M_bucket_count = 1;
  (this->entry_point_with_no_calls_cache_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->entry_point_with_no_calls_cache_)._M_h._M_element_count = 0;
  (this->entry_point_with_no_calls_cache_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->entry_point_with_no_calls_cache_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->entry_point_with_no_calls_cache_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  queue<spvtools::opt::Instruction*,std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
  ::queue<std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>,void>
            (&this->worklist_);
  utils::BitVector::BitVector(&this->live_insts_,0x400);
  (this->live_local_vars_)._M_h._M_buckets = &(this->live_local_vars_)._M_h._M_single_bucket;
  (this->live_local_vars_)._M_h._M_bucket_count = 1;
  (this->live_local_vars_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->live_local_vars_)._M_h._M_element_count = 0;
  (this->live_local_vars_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->live_local_vars_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->live_local_vars_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->to_kill_).
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->to_kill_).
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->to_kill_).
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extensions_allowlist_)._M_h._M_buckets =
       &(this->extensions_allowlist_)._M_h._M_single_bucket;
  (this->extensions_allowlist_)._M_h._M_bucket_count = 1;
  (this->extensions_allowlist_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->extensions_allowlist_)._M_h._M_element_count = 0;
  (this->extensions_allowlist_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->extensions_allowlist_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->extensions_allowlist_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

AggressiveDCEPass(bool preserve_interface = false,
                    bool remove_outputs = false)
      : preserve_interface_(preserve_interface),
        remove_outputs_(remove_outputs) {}